

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_winograd.h
# Opt level: O0

void ncnn::conv3x3s1_winograd63_transform_kernel_tile
               (Mat *kernel,Mat *A,int inch,int i,int max_ii,int k,int max_kk)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int in_ECX;
  int in_EDX;
  undefined8 *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  float ktm4;
  float ktm3;
  float ktm2;
  float ktm1;
  float ktm0;
  int kk;
  int ii;
  float *ptmp;
  int local_d4;
  int local_c4;
  float *local_c0;
  float local_b8 [16];
  float z7;
  float z6;
  float z5;
  float z4;
  float z3;
  float z2;
  float z1;
  float z0;
  float r2_1;
  float r1_1;
  float r0_1;
  int m_1;
  float r2;
  float r1;
  float r0;
  int m;
  float *k0;
  
  k0 = (float *)*in_RSI;
  for (m = 0; m < in_R8D; m = m + 1) {
    for (r0 = 0.0; (int)r0 < in_stack_00000008; r0 = (float)((int)r0 + 1)) {
      local_c0 = (float *)(*in_RDI + (long)((in_ECX + m) * in_EDX * 9) * 4 +
                          (long)((in_R9D + (int)r0) * 9) * 4);
      for (local_c4 = 0; local_c4 < 3; local_c4 = local_c4 + 1) {
        fVar1 = *local_c0;
        fVar2 = local_c0[1];
        fVar3 = local_c0[2];
        local_b8[local_c4] = fVar1;
        local_b8[(long)local_c4 + 3] =
             (-fVar1 * 0.22222222 - fVar2 * 0.22222222) - fVar3 * 0.22222222;
        local_b8[(long)local_c4 + 6] =
             (-fVar1 * 0.22222222 + fVar2 * 0.22222222) - fVar3 * 0.22222222;
        local_b8[(long)local_c4 + 9] =
             fVar1 * 0.011111111 + fVar2 * 0.022222223 + fVar3 * 0.044444446;
        local_b8[(long)local_c4 + 0xc] =
             (fVar1 * 0.011111111 - fVar2 * 0.022222223) + fVar3 * 0.044444446;
        local_b8[(long)local_c4 + 0xf] =
             fVar1 * 0.022222223 + fVar2 * 0.011111111 + fVar3 * 0.0055555557;
        (&z5)[local_c4] = (fVar1 * 0.022222223 - fVar2 * 0.011111111) + fVar3 * 0.0055555557;
        (&z2)[local_c4] = fVar3;
        local_c0 = local_c0 + 3;
      }
      for (local_d4 = 0; local_d4 < 8; local_d4 = local_d4 + 1) {
        fVar1 = local_b8[(long)local_d4 * 3];
        fVar2 = local_b8[(long)local_d4 * 3 + 1];
        fVar3 = local_b8[(long)local_d4 * 3 + 2];
        *k0 = fVar1;
        k0[1] = (-fVar1 * 0.22222222 - fVar2 * 0.22222222) - fVar3 * 0.22222222;
        k0[2] = (-fVar1 * 0.22222222 + fVar2 * 0.22222222) - fVar3 * 0.22222222;
        k0[3] = fVar1 * 0.011111111 + fVar2 * 0.022222223 + fVar3 * 0.044444446;
        k0[4] = (fVar1 * 0.011111111 - fVar2 * 0.022222223) + fVar3 * 0.044444446;
        k0[5] = fVar1 * 0.022222223 + fVar2 * 0.011111111 + fVar3 * 0.0055555557;
        k0[6] = (fVar1 * 0.022222223 - fVar2 * 0.011111111) + fVar3 * 0.0055555557;
        k0[7] = fVar3;
        k0 = k0 + 8;
      }
    }
  }
  return;
}

Assistant:

static inline void conv3x3s1_winograd63_transform_kernel_tile(const Mat& kernel, Mat& A, int inch, int i, int max_ii, int k, int max_kk)
{
    float* ptmp = A;

    int ii = 0;
    for (; ii < max_ii; ii++)
    {
        int kk = 0;
        for (; kk < max_kk; kk++)
        {
            // const float ktm[8][3] = {
            //     {1.0f, 0.0f, 0.0f},
            //     {-2.0f / 9, -2.0f / 9, -2.0f / 9},
            //     {-2.0f / 9, 2.0f / 9, -2.0f / 9},
            //     {1.0f / 90, 1.0f / 45, 2.0f / 45},
            //     {1.0f / 90, -1.0f / 45, 2.0f / 45},
            //     {1.0f / 45, 1.0f / 90, 1.0f / 180},
            //     {1.0f / 45, -1.0f / 90, 1.0f / 180},
            //     {0.0f, 0.0f, 1.0f}
            // };
            const float ktm0 = 2.0f / 9;
            const float ktm1 = 1.0f / 45;
            const float ktm2 = 2.0f / 45;
            const float ktm3 = 1.0f / 90;
            const float ktm4 = 1.0f / 180;

            float tmp[8][3];

            const float* k0 = (const float*)kernel + (i + ii) * inch * 9 + (k + kk) * 9;

            for (int m = 0; m < 3; m++)
            {
                float r0 = k0[0];
                float r1 = k0[1];
                float r2 = k0[2];

                tmp[0][m] = r0;
                tmp[1][m] = -r0 * ktm0 - r1 * ktm0 - r2 * ktm0;
                tmp[2][m] = -r0 * ktm0 + r1 * ktm0 - r2 * ktm0;
                tmp[3][m] = r0 * ktm3 + r1 * ktm1 + r2 * ktm2;
                tmp[4][m] = r0 * ktm3 - r1 * ktm1 + r2 * ktm2;
                tmp[5][m] = r0 * ktm1 + r1 * ktm3 + r2 * ktm4;
                tmp[6][m] = r0 * ktm1 - r1 * ktm3 + r2 * ktm4;
                tmp[7][m] = r2;

                k0 += 3;
            }

            for (int m = 0; m < 8; m++)
            {
                float r0 = tmp[m][0];
                float r1 = tmp[m][1];
                float r2 = tmp[m][2];

                float z0 = r0;
                float z1 = -r0 * ktm0 - r1 * ktm0 - r2 * ktm0;
                float z2 = -r0 * ktm0 + r1 * ktm0 - r2 * ktm0;
                float z3 = r0 * ktm3 + r1 * ktm1 + r2 * ktm2;
                float z4 = r0 * ktm3 - r1 * ktm1 + r2 * ktm2;
                float z5 = r0 * ktm1 + r1 * ktm3 + r2 * ktm4;
                float z6 = r0 * ktm1 - r1 * ktm3 + r2 * ktm4;
                float z7 = r2;

                ptmp[0] = z0;
                ptmp[1] = z1;
                ptmp[2] = z2;
                ptmp[3] = z3;
                ptmp[4] = z4;
                ptmp[5] = z5;
                ptmp[6] = z6;
                ptmp[7] = z7;
                ptmp += 8;
            }
        }
    }
}